

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall
ON_3dVector::Decompose
          (ON_3dVector *this,ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z,double *a,double *b,
          double *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  double row2 [3];
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  double local_30;
  double dStack_28;
  double local_18;
  double dStack_10;
  double local_8;
  
  local_60 = 0.0;
  dVar1 = X->x;
  dVar2 = X->y;
  dVar3 = X->z;
  dVar4 = Y->x;
  dVar5 = Y->y;
  dVar6 = Y->z;
  local_18 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  local_38 = dVar6 * dVar3 + dVar4 * dVar1 + dVar5 * dVar2;
  dVar7 = Z->x;
  dVar8 = Z->y;
  dVar9 = Z->z;
  local_58 = dVar3 * dVar9 + dVar1 * dVar7 + dVar2 * dVar8;
  local_30 = dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5;
  local_50 = dVar9 * dVar6 + dVar7 * dVar4 + dVar8 * dVar5;
  local_48 = dVar9 * dVar9 + dVar7 * dVar7 + dVar8 * dVar8;
  dVar10 = this->x;
  dVar11 = this->y;
  dVar12 = this->z;
  dStack_28 = local_50;
  dStack_10 = local_38;
  local_8 = local_58;
  iVar13 = ON_Solve3x3(&local_18,&local_38,&local_58,
                       dVar3 * dVar12 + dVar1 * dVar10 + dVar2 * dVar11,
                       dVar6 * dVar12 + dVar4 * dVar10 + dVar5 * dVar11,
                       dVar12 * dVar9 + dVar10 * dVar7 + dVar8 * dVar11,a,b,c,&local_60);
  return iVar13 == 3;
}

Assistant:

bool ON_3dVector::Decompose( // Computes a, b, c such that this vector = a*X + b*Y + c*Z
       //
       // If X,Y,Z is known to be an orthonormal frame,
       // then a = V*X, b = V*Y, c = V*Z will compute
       // the same result more quickly.
       const ON_3dVector& X,
       const ON_3dVector& Y,
       const ON_3dVector& Z,
       double* a,
       double* b,
       double* c
       ) const
{
  int rank;
  double pivot_ratio = 0.0;
  double row0[3], row1[3], row2[3];
  row0[0] = X*X;   row0[1] = X*Y;   row0[2] = X*Z;
  row1[0] = row0[1]; row1[1] = Y*Y;   row1[2] = Y*Z;
  row2[0] = row0[2]; row2[1] = row1[2]; row2[2] = Z*Z;
  rank = ON_Solve3x3( row0, row1, row2, 
                    (*this)*X, (*this)*Y, (*this)*Z,
                    a, b, c, &pivot_ratio );
  return (rank == 3) ? true : false;
}